

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorStraightGradientInstancer::InstanceDecorator
          (DecoratorStraightGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  Direction DVar3;
  Colour<unsigned_char,_255,_false> CVar4;
  Colour<unsigned_char,_255,_false> CVar5;
  Property *pPVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<Decorator> SVar7;
  SharedPtr<Rml::DecoratorStraightGradient> decorator;
  
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            properties_,"horizontal-gradient");
  DVar3 = Horizontal;
  if (!bVar2) {
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              properties_,"vertical-gradient");
    if (bVar2) {
      DVar3 = Vertical;
    }
    else {
      pPVar6 = PropertyDictionary::GetProperty
                         ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
      DVar3 = Property::Get<int>(pPVar6);
      Log::Message(LT_WARNING,
                   "Decorator syntax \'gradient(horizontal|vertical ...)\' is deprecated, please replace with \'horizontal-gradient(...)\' or \'vertical-gradient(...)\'"
                  );
    }
  }
  pPVar6 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  CVar4 = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar6);
  pPVar6 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  CVar5 = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar6);
  ::std::make_shared<Rml::DecoratorStraightGradient>();
  _Var1 = decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  (decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->direction = DVar3;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->start).red = CVar4.red;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->start).green = CVar4.green;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->start).blue = CVar4.blue;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->start).alpha = CVar4.alpha;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop).red = CVar5.red;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop).green = CVar5.green;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop).blue = CVar5.blue;
  ((decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop).alpha = CVar5.alpha;
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)
       decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
  decorator.super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&decorator.
              super___shared_ptr<Rml::DecoratorStraightGradient,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorStraightGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	using Direction = DecoratorStraightGradient::Direction;
	Direction direction;
	if (name == "horizontal-gradient")
		direction = Direction::Horizontal;
	else if (name == "vertical-gradient")
		direction = Direction::Vertical;
	else
	{
		direction = (Direction)properties_.GetProperty(ids.direction)->Get<int>();
		Log::Message(Log::LT_WARNING,
			"Decorator syntax 'gradient(horizontal|vertical ...)' is deprecated, please replace with 'horizontal-gradient(...)' or "
			"'vertical-gradient(...)'");
	}

	Colourb start = properties_.GetProperty(ids.start)->Get<Colourb>();
	Colourb stop = properties_.GetProperty(ids.stop)->Get<Colourb>();

	auto decorator = MakeShared<DecoratorStraightGradient>();
	if (decorator->Initialise(direction, start, stop))
		return decorator;

	return nullptr;
}